

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codacmp.c
# Opt level: O3

void main_cold_6(void)

{
  char *pcVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  
  __stream = _stderr;
  pcVar1 = pre[0];
  piVar2 = coda_get_errno();
  pcVar3 = coda_errno_to_string(*piVar2);
  fprintf(__stream,"%sERROR: %s\n",pcVar1,pcVar3);
  return;
}

Assistant:

static int compare_files(char *filename1, char *filename2, char *starting_path)
{
    coda_product *pf1;
    coda_product *pf2;
    coda_cursor cursor1;
    coda_cursor cursor2;
    int result;

    result = coda_open(filename1, &pf1);
    if (result != 0 && coda_errno == CODA_ERROR_FILE_OPEN)
    {
        /* maybe not enough memory space to map the file in memory =>
         * temporarily disable memory mapping of files and try again
         */
        coda_set_option_use_mmap(0);
        result = coda_open(filename1, &pf1);
        coda_set_option_use_mmap(1);
    }
    if (result != 0)
    {
        fprintf(stderr, "%sERROR: %s\n", pre[0], coda_errno_to_string(coda_errno));
        return -1;
    }

    if (array_key_info_set_product(pf1) != 0)
    {
        fprintf(stderr, "%sERROR: %s\n", pre[0], coda_errno_to_string(coda_errno));
        return -1;
    }

    result = coda_open(filename2, &pf2);
    if (result != 0 && coda_errno == CODA_ERROR_FILE_OPEN)
    {
        coda_set_option_use_mmap(0);
        result = coda_open(filename2, &pf2);
        coda_set_option_use_mmap(1);
    }
    if (result != 0)
    {
        fprintf(stderr, "%sERROR: %s\n", pre[1], coda_errno_to_string(coda_errno));
        coda_close(pf1);
        return -1;
    }

    if (coda_cursor_set_product(&cursor1, pf1) != 0)
    {
        fprintf(stderr, "%sERROR: %s\n", pre[0], coda_errno_to_string(coda_errno));
        coda_close(pf1);
        coda_close(pf2);
        return -1;
    }

    if (coda_cursor_set_product(&cursor2, pf2) != 0)
    {
        fprintf(stderr, "%sERROR: %s\n", pre[1], coda_errno_to_string(coda_errno));
        coda_close(pf1);
        coda_close(pf2);
        return -1;
    }

    if (starting_path != NULL)
    {
        if (coda_cursor_goto(&cursor1, starting_path) != 0)
        {
            fprintf(stderr, "%sERROR: %s\n", pre[0], coda_errno_to_string(coda_errno));
            coda_close(pf1);
            coda_close(pf2);
            return -1;
        }

        if (coda_cursor_goto(&cursor2, starting_path) != 0)
        {
            fprintf(stderr, "%sERROR: %s\n", pre[1], coda_errno_to_string(coda_errno));
            coda_close(pf1);
            coda_close(pf2);
            return -1;
        }

    }

    result = compare_data(&cursor1, &cursor2);

    coda_close(pf1);
    coda_close(pf2);

    return result;
}